

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.hpp
# Opt level: O2

signature_element *
boost::python::detail::signature_arity<5U>::
impl<boost::mpl::vector6<bool,_StimulationCommand_&,_int,_int,_int,_int>_>::elements(void)

{
  char *pcVar1;
  int iVar2;
  char *raw_name;
  
  if (signature_arity<5u>::impl<boost::mpl::vector6<bool,StimulationCommand&,int,int,int,int>>::
      elements()::result == '\0') {
    iVar2 = __cxa_guard_acquire(&signature_arity<5u>::
                                 impl<boost::mpl::vector6<bool,StimulationCommand&,int,int,int,int>>
                                 ::elements()::result);
    if (iVar2 != 0) {
      elements::result[0].basename =
           (char *)gcc_demangle(_PyNumber_Multiply + (*_PyNumber_Multiply == '*'));
      elements::result[0].pytype_f = converter::expected_pytype_for_arg<bool>::get_pytype;
      elements::result[0].lvalue = false;
      elements::result[1].basename = (char *)gcc_demangle("18StimulationCommand");
      pcVar1 = _compare;
      elements::result[1].pytype_f =
           converter::expected_pytype_for_arg<StimulationCommand_&>::get_pytype;
      elements::result[1].lvalue = true;
      elements::result[2].basename = (char *)gcc_demangle(_compare + (*_compare == '*'));
      elements::result[2].pytype_f = converter::expected_pytype_for_arg<int>::get_pytype;
      elements::result[2].lvalue = false;
      elements::result[3].basename = (char *)gcc_demangle(pcVar1 + (*pcVar1 == '*'));
      elements::result[3].pytype_f = converter::expected_pytype_for_arg<int>::get_pytype;
      elements::result[3].lvalue = false;
      elements::result[4].basename = (char *)gcc_demangle(pcVar1 + (*pcVar1 == '*'));
      elements::result[4].pytype_f = converter::expected_pytype_for_arg<int>::get_pytype;
      elements::result[4].lvalue = false;
      elements::result[5].basename = (char *)gcc_demangle(pcVar1 + (*pcVar1 == '*'));
      elements::result[5].pytype_f = converter::expected_pytype_for_arg<int>::get_pytype;
      elements::result[5].lvalue = false;
      elements::result[6].basename = (char *)0x0;
      elements::result[6].pytype_f = (pytype_function)0x0;
      elements::result[6].lvalue = false;
      elements::result[6]._17_7_ = 0;
      __cxa_guard_release(&signature_arity<5u>::
                           impl<boost::mpl::vector6<bool,StimulationCommand&,int,int,int,int>>::
                           elements()::result);
    }
  }
  return elements::result;
}

Assistant:

static signature_element const* elements()
        {
            static signature_element const result[N+2] = {
                
#ifndef BOOST_PYTHON_NO_PY_SIGNATURES
# define BOOST_PP_LOCAL_MACRO(i)                                                            \
                {                                                                           \
                  type_id<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>().name()           \
                  , &converter::expected_pytype_for_arg<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::get_pytype   \
                  , indirect_traits::is_reference_to_non_const<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::value \
                },
#else
# define BOOST_PP_LOCAL_MACRO(i)                                                            \
                {                                                                           \
                  type_id<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>().name()           \
                  , 0 \
                  , indirect_traits::is_reference_to_non_const<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::value \
                },
#endif
                
# define BOOST_PP_LOCAL_LIMITS (0, N)
# include BOOST_PP_LOCAL_ITERATE()
                {0,0,0}
            };
            return result;
        }